

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_handle.c
# Opt level: O3

log_handle log_handle_initialize(log_handle handle)

{
  size_t sVar1;
  log_record plVar2;
  
  if (handle != (log_handle)0x0) {
    sVar1 = log_record_size();
    plVar2 = (log_record)malloc(sVar1 << 8);
    handle->buffer = plVar2;
    handle->count = 0;
    handle->size = 0x100;
    if (plVar2 != (log_record)0x0) {
      return handle;
    }
    free(handle);
  }
  return (log_handle)0x0;
}

Assistant:

log_handle log_handle_initialize(log_handle handle)
{
	if (handle == NULL)
	{
		return NULL;
	}

	handle->buffer = malloc(LOG_HANDLE_RECORD_SIZE_DEFAULT * log_record_size());

	handle->count = 0;

	handle->size = LOG_HANDLE_RECORD_SIZE_DEFAULT;

	if (handle->buffer == NULL)
	{
		free(handle);

		return NULL;
	}

	return handle;
}